

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

void duckdb_lz4::LZ4_prepareTable(LZ4_stream_t_internal *cctx,int inputSize,tableType_t tableType)

{
  if (cctx->tableType == clearedTable) goto LAB_0111589e;
  if (cctx->tableType == tableType) {
    if (tableType == byU32) {
      if ((inputSize < 0x1000) && (cctx->currentOffset < 0x40000001)) goto LAB_0111589e;
    }
    else if (((tableType != byU16) || (cctx->currentOffset + inputSize < 0xffff)) &&
            (inputSize < 0x1000)) goto LAB_0111589e;
  }
  switchD_005700f1::default(cctx,0,0x4000);
  cctx->currentOffset = 0;
  cctx->tableType = 0;
LAB_0111589e:
  if (tableType == byU32 && cctx->currentOffset != 0) {
    cctx->currentOffset = cctx->currentOffset + 0x10000;
  }
  cctx->dictSize = 0;
  cctx->dictionary = (LZ4_byte *)0x0;
  cctx->dictCtx = (LZ4_stream_t_internal *)0x0;
  return;
}

Assistant:

LZ4_FORCE_INLINE void
LZ4_prepareTable(LZ4_stream_t_internal* const cctx,
           const int inputSize,
           const tableType_t tableType) {
    /* If the table hasn't been used, it's guaranteed to be zeroed out, and is
     * therefore safe to use no matter what mode we're in. Otherwise, we figure
     * out if it's safe to leave as is or whether it needs to be reset.
     */
    if ((tableType_t)cctx->tableType != clearedTable) {
        assert(inputSize >= 0);
        if ((tableType_t)cctx->tableType != tableType
          || ((tableType == byU16) && cctx->currentOffset + (unsigned)inputSize >= 0xFFFFU)
          || ((tableType == byU32) && cctx->currentOffset > 1 GB)
          || tableType == byPtr
          || inputSize >= 4 KB)
        {
            DEBUGLOG(4, "LZ4_prepareTable: Resetting table in %p", cctx);
            MEM_INIT(cctx->hashTable, 0, LZ4_HASHTABLESIZE);
            cctx->currentOffset = 0;
            cctx->tableType = (U32)clearedTable;
        } else {
            DEBUGLOG(4, "LZ4_prepareTable: Re-use hash table (no reset)");
        }
    }

    /* Adding a gap, so all previous entries are > LZ4_DISTANCE_MAX back,
     * is faster than compressing without a gap.
     * However, compressing with currentOffset == 0 is faster still,
     * so we preserve that case.
     */
    if (cctx->currentOffset != 0 && tableType == byU32) {
        DEBUGLOG(5, "LZ4_prepareTable: adding 64KB to currentOffset");
        cctx->currentOffset += 64 KB;
    }

    /* Finally, clear history */
    cctx->dictCtx = NULL;
    cctx->dictionary = NULL;
    cctx->dictSize = 0;
}